

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)

{
  pthread_mutex_t *__mutex;
  int MyRank;
  RegisterQueue __ptr;
  _ReaderRegisterMsg *p_Var1;
  CPTimestepList p_Var2;
  undefined8 *puVar3;
  ssize_t *psVar4;
  int iVar5;
  WS_ReaderInfo __s;
  int *piVar6;
  CP_PeerConnection *pCVar7;
  attr_list p_Var8;
  DP_WSR_Stream pvVar9;
  undefined8 uVar10;
  CMConnection p_Var11;
  SstStream p_Var12;
  uint *puVar13;
  WS_ReaderInfo *pp_Var14;
  void **__ptr_00;
  WS_ReaderInfo p_Var15;
  long lVar16;
  long *plVar17;
  uint uVar18;
  CMConnection *pp_Var19;
  ssize_t Ret;
  undefined4 uVar20;
  long lVar21;
  size_t __size;
  void *free_block;
  void *ret_data_block;
  void *DP_WriterInfo;
  ssize_t GlobalStartingTimestep;
  int GlobalSuccess;
  int MySuccess;
  _CP_DP_PairInfo combined_init;
  int local_cc;
  CMConnection local_c8;
  void *local_b8;
  int local_ac;
  undefined8 local_a8;
  SstParams p_Stack_a0;
  void **local_98;
  WS_ReaderInfo p_Stack_90;
  void *local_88;
  size_t local_80;
  void *local_78;
  void *local_70;
  void **local_68;
  int local_60;
  undefined4 local_5c;
  char **local_58;
  void *local_50;
  char *local_48;
  WS_ReaderInfo local_40;
  long local_38;
  
  local_b8 = (void *)0x0;
  __s = (WS_ReaderInfo)malloc(0x90);
  CP_verbose(Stream,PerRankVerbose,"Beginning writer-side reader open protocol\n");
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
    __ptr = Stream->ReaderRegisterQueue;
    Stream->ReaderRegisterQueue = __ptr->Next;
    __ptr->Next = (_RegisterQueue *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
    p_Var1 = __ptr->Msg;
    local_a8 = (uint *)(ulong)(uint)p_Var1->ReaderCohortSize;
    p_Stack_a0 = (SstParams)p_Var1->CP_ReaderInfo;
    local_98 = p_Var1->DP_ReaderInfo;
    local_88 = (void *)(ulong)p_Var1->SpecPreload;
    p_Stack_90 = __s;
    piVar6 = (int *)CP_distributeDataFromRankZero
                              (Stream,&local_a8,Stream->CPInfo->CombinedReaderInfoFormat,&local_b8);
    local_c8 = __ptr->Conn;
    local_cc = __ptr->Msg->WriterResponseCondition;
    CMreturn_buffer(Stream->CPInfo->SharedCM->cm);
    free(__ptr);
  }
  else {
    local_c8 = (CMConnection)0x0;
    piVar6 = (int *)CP_distributeDataFromRankZero
                              (Stream,(void *)0x0,Stream->CPInfo->CombinedReaderInfoFormat,&local_b8
                              );
    local_cc = -1;
  }
  iVar5 = *piVar6;
  pCVar7 = (CP_PeerConnection *)calloc(0x18,(long)iVar5);
  if (0 < (long)iVar5) {
    pp_Var19 = &pCVar7->CMconn;
    lVar21 = 0;
    do {
      p_Var8 = (attr_list)
               attr_list_from_string(**(undefined8 **)(*(long *)(piVar6 + 2) + lVar21 * 8));
      ((CP_PeerConnection *)(pp_Var19 + -2))->ContactList = p_Var8;
      pp_Var19[-1] = (CMConnection)*(void **)(*(long *)(*(long *)(piVar6 + 2) + lVar21 * 8) + 8);
      if ((lVar21 == 0) && (local_c8 != (CMConnection)0x0)) {
        CMConnection_add_reference(local_c8);
        *pp_Var19 = local_c8;
        CMconn_register_close_handler(local_c8,WriterConnCloseHandler,__s);
      }
      else {
        *pp_Var19 = (CMConnection)0x0;
      }
      lVar21 = lVar21 + 1;
      iVar5 = *piVar6;
      pp_Var19 = pp_Var19 + 3;
    } while (lVar21 < iVar5);
  }
  pvVar9 = (*Stream->DP_Interface->initWriterPerReader)
                     (&Svcs,Stream->DP_Stream,iVar5,pCVar7,*(void ***)(piVar6 + 4),&local_70);
  memset(__s,0,0x90);
  __s->RankZeroID = *(void **)(piVar6 + 6);
  __s->DP_WSR_Stream = pvVar9;
  __s->ParentStream = Stream;
  __s->LastReleasedTimestep = -1;
  __s->Connections = pCVar7;
  __s->FullCommPatternLocked = 0;
  __s->CommPatternLockTimestep = -1;
  __s->ReaderStatus = Opening;
  p_Var12 = Stream;
  if (piVar6[8] == 1) {
    __s->PreloadMode = SstPreloadSpeculative;
    CP_verbose(Stream,PerStepVerbose,"Setting SpeculativePreload ON for new reader\n");
    p_Var12 = __s->ParentStream;
    pCVar7 = __s->Connections;
  }
  iVar5 = *piVar6;
  __size = (size_t)iVar5;
  plVar17 = *(long **)(piVar6 + 2);
  MyRank = p_Var12->Rank;
  local_ac = p_Var12->CohortSize;
  __s->ReaderCohortSize = iVar5;
  if (pCVar7 == (CP_PeerConnection *)0x0) {
    pCVar7 = (CP_PeerConnection *)calloc(0x18,__size);
    __s->Connections = pCVar7;
  }
  local_80 = __size;
  if (0 < iVar5) {
    lVar21 = 0;
    do {
      if (*(long *)((long)&pCVar7->ContactList + lVar21) == 0) {
        uVar10 = attr_list_from_string(*(undefined8 *)*plVar17);
        pCVar7 = __s->Connections;
        *(undefined8 *)((long)&pCVar7->ContactList + lVar21) = uVar10;
      }
      *(undefined8 *)((long)&pCVar7->RemoteStreamID + lVar21) = *(undefined8 *)(*plVar17 + 8);
      lVar21 = lVar21 + 0x18;
      plVar17 = plVar17 + 1;
    } while (__size * 0x18 != lVar21);
  }
  if (p_Var12->ConfigParams->CPCommPattern == 1) {
    getPeerArrays(local_ac,MyRank,(int)local_80,&__s->Peers,(int **)&local_a8);
    uVar18 = *local_a8;
    if (uVar18 != 0xffffffff) {
      lVar21 = 0;
      do {
        iVar5 = __s->ParentStream->ConnectionUsleepMultiplier;
        if (iVar5 != 0) {
          usleep(iVar5 * MyRank);
        }
        p_Var11 = __s->Connections[(int)uVar18].CMconn;
        if (p_Var11 == (CMConnection)0x0) {
          p_Var11 = Tunneling_get_conn(__s->ParentStream->CPInfo->SharedCM->cm,
                                       __s->Connections[(int)uVar18].ContactList);
          __s->Connections[(int)uVar18].CMconn = p_Var11;
          if (p_Var11 == (CMConnection)0x0) {
            CP_error(__s->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
            p_Var12 = __s->ParentStream;
            uVar10 = attr_list_to_string(__s->Connections[(int)uVar18].ContactList);
            goto LAB_0072eb38;
          }
        }
        CP_verbose(p_Var12,TraceVerbose,
                   "Registering a close handler for connection %p, to peer %d\n",p_Var11,
                   (ulong)uVar18);
        CMconn_register_close_handler
                  (__s->Connections[(int)uVar18].CMconn,WriterConnCloseHandler,__s);
        CP_verbose(__s->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n",(ulong)uVar18);
        SendPeerSetupMsg((WS_ReaderInfo)__s->ParentStream,(int)__s->Connections,uVar18);
        uVar18 = local_a8[lVar21 + 1];
        lVar21 = lVar21 + 1;
      } while (uVar18 != 0xffffffff);
    }
    free(local_a8);
    puVar13 = (uint *)__s->Peers;
    uVar18 = *puVar13;
    uVar20 = 1;
    if (uVar18 != 0xffffffff) {
      lVar21 = 4;
      do {
        pCVar7 = __s->Connections;
        if (pCVar7[(int)uVar18].CMconn == (CMConnection)0x0) {
          p_Var12 = __s->ParentStream;
          if (p_Var12->ConnectionUsleepMultiplier != 0) {
            usleep(p_Var12->ConnectionUsleepMultiplier * MyRank);
            p_Var12 = __s->ParentStream;
            pCVar7 = __s->Connections;
          }
          p_Var11 = Tunneling_get_conn(p_Var12->CPInfo->SharedCM->cm,pCVar7[(int)uVar18].ContactList
                                      );
          __s->Connections[(int)uVar18].CMconn = p_Var11;
          if (p_Var11 == (CMConnection)0x0) {
            CP_error(__s->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
            p_Var12 = __s->ParentStream;
            uVar10 = attr_list_to_string(__s->Connections[(int)uVar18].ContactList);
LAB_0072eb38:
            uVar20 = 0;
            CP_error(p_Var12,"%s\n",uVar10);
            goto LAB_0072eb47;
          }
          CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,__s);
          CP_verbose(__s->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n",(ulong)uVar18)
          ;
          SendPeerSetupMsg((WS_ReaderInfo)__s->ParentStream,(int)__s->Connections,uVar18);
          puVar13 = (uint *)__s->Peers;
        }
        uVar18 = *(uint *)((long)puVar13 + lVar21);
        lVar21 = lVar21 + 4;
      } while (uVar18 != 0xffffffff);
      uVar20 = 1;
    }
  }
  else {
    uVar20 = 1;
    if (p_Var12->Rank == 0) {
      p_Var11 = pCVar7->CMconn;
      if (p_Var11 == (CMConnection)0x0) {
        p_Var11 = Tunneling_get_conn(__s->ParentStream->CPInfo->SharedCM->cm,pCVar7->ContactList);
        __s->Connections->CMconn = p_Var11;
        if (p_Var11 == (CMConnection)0x0) {
          uVar20 = 0;
          CP_error(__s->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
          p_Var12 = __s->ParentStream;
          uVar10 = attr_list_to_string(__s->Connections->ContactList);
          CP_error(p_Var12,"%s\n",uVar10);
          goto LAB_0072eb47;
        }
      }
      CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,__s);
    }
  }
LAB_0072eb47:
  local_60 = 0;
  local_5c = uVar20;
  SMPI_Allreduce(&local_5c,&local_60,1,SMPI_INT,SMPI_LAND,Stream->mpiComm);
  if (local_60 == 0) {
    __s = (WS_ReaderInfo)0x0;
  }
  else {
    AddToLastCallFreeList(__s);
    free(local_b8);
    __mutex = &Stream->DataLock;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    pp_Var14 = (WS_ReaderInfo *)realloc(Stream->Readers,(long)Stream->ReaderCount * 8 + 8);
    Stream->Readers = pp_Var14;
    iVar5 = Stream->ReaderCount;
    pp_Var14[iVar5] = __s;
    Stream->ReaderCount = iVar5 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_48 = CP_GetContactString(Stream,(attr_list)0x0);
    local_58 = &local_48;
    local_50 = local_70;
    lVar21 = Stream->WriterTimestep;
    p_Var2 = Stream->QueuedTimesteps;
    local_40 = __s;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (p_Var2 != (CPTimestepList)0x0) {
      CP_verbose(Stream,TraceVerbose,
                 "Earliest available : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,p_Var2->Timestep,(ulong)(uint)p_Var2->ReferenceCount,(ulong)(uint)p_Var2->Expired,
                 p_Var2->PreciousTimestep);
      psVar4 = &p_Var2->Timestep;
      p_Var2 = p_Var2->Next;
      if (*psVar4 < lVar21) {
        lVar21 = *psVar4;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_38 = 0;
    if (lVar21 != -1) {
      local_38 = lVar21;
    }
    SMPI_Allreduce(&local_38,&local_68,1,SMPI_LONG,SMPI_MAX,Stream->mpiComm);
    CP_verbose(Stream,TraceVerbose,"My oldest timestep was %zd, global oldest timestep was %zd\n",
               local_38,local_68);
    __s->StartingTimestep = (ssize_t)local_68;
    __ptr_00 = CP_consolidateDataToRankZero
                         (Stream,&local_58,Stream->CPInfo->PerRankWriterInfoFormat,&local_78);
    if (Stream->Rank == 0) {
      lVar21 = (long)Stream->CohortSize;
      local_a8 = (uint *)CONCAT44(Stream->CohortSize,local_cc);
      p_Stack_a0 = Stream->ConfigParams;
      local_98 = local_68;
      p_Var15 = (WS_ReaderInfo)malloc(lVar21 * 8);
      p_Stack_90 = p_Var15;
      local_88 = malloc(lVar21 * 8);
      if (0 < lVar21) {
        lVar16 = 0;
        do {
          puVar3 = (undefined8 *)__ptr_00[lVar16];
          (&p_Var15->ParentStream)[lVar16] = (SstStream)*puVar3;
          *(undefined8 *)((long)local_88 + lVar16 * 8) = puVar3[1];
          lVar16 = lVar16 + 1;
        } while (lVar21 != lVar16);
      }
      iVar5 = CMwrite(local_c8,Stream->CPInfo->SharedCM->WriterResponseFormat,&local_a8);
      if (iVar5 != 1) {
        CP_verbose(Stream,CriticalVerbose,
                   "Message failed to send to reader in participate in reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n"
                  );
      }
      free(p_Stack_90);
      free(local_88);
    }
    free(local_48);
    if (local_78 != (void *)0x0) {
      free(local_78);
    }
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
    }
    CP_verbose(Stream,PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, reader ready response pending\n"
               ,__s);
  }
  return __s;
}

Assistant:

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)
{
    RegisterQueue Req;
    reader_data_t ReturnData;
    void *free_block = NULL;
    int WriterResponseCondition = -1;
    CMConnection conn = NULL;
    ssize_t MyStartingTimestep, GlobalStartingTimestep;
    WS_ReaderInfo CP_WSR_Stream = malloc(sizeof(*CP_WSR_Stream));

    CP_verbose(Stream, PerRankVerbose, "Beginning writer-side reader open protocol\n");
    if (Stream->Rank == 0)
    {
        STREAM_MUTEX_LOCK(Stream);
        assert((Stream->ReaderRegisterQueue));
        Req = Stream->ReaderRegisterQueue;
        Stream->ReaderRegisterQueue = Req->Next;
        Req->Next = NULL;
        STREAM_MUTEX_UNLOCK(Stream);
        struct _CombinedReaderInfo reader_data;
        memset(&reader_data, 0, sizeof(reader_data));
        reader_data.ReaderCohortSize = Req->Msg->ReaderCohortSize;
        reader_data.CP_ReaderInfo = Req->Msg->CP_ReaderInfo;
        reader_data.DP_ReaderInfo = Req->Msg->DP_ReaderInfo;
        reader_data.RankZeroID = CP_WSR_Stream;
        reader_data.SpecPreload = Req->Msg->SpecPreload;
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &reader_data, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
        WriterResponseCondition = Req->Msg->WriterResponseCondition;
        conn = Req->Conn;
        CMreturn_buffer(Stream->CPInfo->SharedCM->cm, Req->Msg);
        free(Req);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
    }
    //    printf("I am writer rank %d, my info on readers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_reader_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    DP_WSR_Stream per_reader_Stream;
    void *DP_WriterInfo;
    void *ret_data_block;
    CP_PeerConnection *connections_to_reader;
    connections_to_reader = calloc(sizeof(CP_PeerConnection), ReturnData->ReaderCohortSize);
    for (int i = 0; i < ReturnData->ReaderCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_ReaderInfo[i]->ContactInfo);
        connections_to_reader[i].ContactList = attrs;
        connections_to_reader[i].RemoteStreamID = ReturnData->CP_ReaderInfo[i]->ReaderID;
        if ((i == 0) && (conn != NULL))
        {
            // reuse existing connection to reader rank 0
            // (only not NULL if this is writer rank 0)
            CMConnection_add_reference(conn);
            connections_to_reader[i].CMconn = conn;
            CMconn_register_close_handler(conn, WriterConnCloseHandler, (void *)CP_WSR_Stream);
        }
        else
        {
            connections_to_reader[i].CMconn = NULL;
        }
    }

    per_reader_Stream = Stream->DP_Interface->initWriterPerReader(
        &Svcs, Stream->DP_Stream, ReturnData->ReaderCohortSize, connections_to_reader,
        ReturnData->DP_ReaderInfo, &DP_WriterInfo);

    memset(CP_WSR_Stream, 0, sizeof(*CP_WSR_Stream));
    CP_WSR_Stream->ReaderStatus = NotOpen;
    CP_WSR_Stream->RankZeroID = ReturnData->RankZeroID;

    CP_WSR_Stream->DP_WSR_Stream = per_reader_Stream;
    CP_WSR_Stream->ParentStream = Stream;
    CP_WSR_Stream->LastReleasedTimestep = -1;
    CP_WSR_Stream->Connections = connections_to_reader;
    CP_WSR_Stream->LocalReaderDefinitionsLocked = 0;
    CP_WSR_Stream->FullCommPatternLocked = 0;
    CP_WSR_Stream->CommPatternLockTimestep = -1;
    CP_WSR_Stream->ReaderStatus = Opening;
    if (ReturnData->SpecPreload == SpecPreloadOn)
    {

        CP_WSR_Stream->PreloadMode = SstPreloadSpeculative;
        CP_WSR_Stream->PreloadModeActiveTimestep = 0;
        CP_verbose(Stream, PerStepVerbose, "Setting SpeculativePreload ON for new reader\n");
    }

    int MySuccess =
        initWSReader(CP_WSR_Stream, ReturnData->ReaderCohortSize, ReturnData->CP_ReaderInfo);

    int GlobalSuccess = 0;
    SMPI_Allreduce(&MySuccess, &GlobalSuccess, 1, SMPI_INT, SMPI_LAND, Stream->mpiComm);

    if (!GlobalSuccess)
    {
        return NULL;
    }
    AddToLastCallFreeList(CP_WSR_Stream);
    free(free_block);
    ReturnData = NULL; /* now invalid */

    STREAM_MUTEX_LOCK(Stream);
    Stream->Readers =
        realloc(Stream->Readers, sizeof(Stream->Readers[0]) * (Stream->ReaderCount + 1));
    Stream->Readers[Stream->ReaderCount] = CP_WSR_Stream;
    Stream->ReaderCount++;
    STREAM_MUTEX_UNLOCK(Stream);

    struct _CP_DP_PairInfo combined_init;
    struct _CP_WriterInitInfo cpInfo;

    struct _CP_DP_PairInfo **pointers = NULL;

    memset(&cpInfo, 0, sizeof(cpInfo));
    cpInfo.ContactInfo = CP_GetContactString(Stream, NULL);
    cpInfo.WriterID = CP_WSR_Stream;

    combined_init.CP_Info = (void **)&cpInfo;
    combined_init.DP_Info = DP_WriterInfo;

    MyStartingTimestep = earliestAvailableTimestepNumber(Stream, Stream->WriterTimestep);
    if (MyStartingTimestep == -1)
        MyStartingTimestep = 0;

    SMPI_Allreduce(&MyStartingTimestep, &GlobalStartingTimestep, 1, SMPI_LONG, SMPI_MAX,
                   Stream->mpiComm);

    CP_verbose(Stream, TraceVerbose, "My oldest timestep was %zd, global oldest timestep was %zd\n",
               MyStartingTimestep, GlobalStartingTimestep);

    CP_WSR_Stream->StartingTimestep = GlobalStartingTimestep;

    pointers = (struct _CP_DP_PairInfo **)CP_consolidateDataToRankZero(
        Stream, &combined_init, Stream->CPInfo->PerRankWriterInfoFormat, &ret_data_block);

    if (Stream->Rank == 0)
    {
        struct _WriterResponseMsg response;
        memset(&response, 0, sizeof(response));
        response.WriterResponseCondition = WriterResponseCondition;
        response.WriterCohortSize = Stream->CohortSize;
        response.WriterConfigParams = Stream->ConfigParams;
        response.NextStepNumber = GlobalStartingTimestep;
        response.CP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        response.DP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        for (int i = 0; i < response.WriterCohortSize; i++)
        {
            response.CP_WriterInfo[i] = (struct _CP_WriterInitInfo *)pointers[i]->CP_Info;
            response.DP_WriterInfo[i] = pointers[i]->DP_Info;
        }
        STREAM_ASSERT_UNLOCKED(Stream);
        if (CMwrite(conn, Stream->CPInfo->SharedCM->WriterResponseFormat, &response) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to reader in participate in "
                       "reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
        }
        free(response.CP_WriterInfo);
        free(response.DP_WriterInfo);
    }
    free(cpInfo.ContactInfo);
    if (ret_data_block)
        free(ret_data_block);
    if (pointers)
        free(pointers);
    CP_verbose(Stream, PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, "
               "reader ready response pending\n",
               CP_WSR_Stream);
    return CP_WSR_Stream;
}